

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl_util.h
# Opt level: O2

void google::protobuf::
     STLDeleteContainerPointers<__gnu_cxx::__normal_iterator<google::protobuf::TextFormat::ParseInfoTree**,std::vector<google::protobuf::TextFormat::ParseInfoTree*,std::allocator<google::protobuf::TextFormat::ParseInfoTree*>>>>
               (__normal_iterator<google::protobuf::TextFormat::ParseInfoTree_**,_std::vector<google::protobuf::TextFormat::ParseInfoTree_*,_std::allocator<google::protobuf::TextFormat::ParseInfoTree_*>_>_>
                begin,__normal_iterator<google::protobuf::TextFormat::ParseInfoTree_**,_std::vector<google::protobuf::TextFormat::ParseInfoTree_*,_std::allocator<google::protobuf::TextFormat::ParseInfoTree_*>_>_>
                      end)

{
  ParseInfoTree *this;
  
  for (; begin._M_current != end._M_current; begin._M_current = begin._M_current + 1) {
    this = *begin._M_current;
    if (this != (ParseInfoTree *)0x0) {
      TextFormat::ParseInfoTree::~ParseInfoTree(this);
    }
    operator_delete(this,0x60);
  }
  return;
}

Assistant:

void STLDeleteContainerPointers(ForwardIterator begin,
                                ForwardIterator end) {
  while (begin != end) {
    ForwardIterator temp = begin;
    ++begin;
    delete *temp;
  }
}